

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O0

int EVP_PKEY_CTX_get0_rsa_oaep_label(EVP_PKEY_CTX *ctx,uint8_t **out_label)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  undefined1 local_30 [8];
  CBS label;
  uint8_t **out_label_local;
  EVP_PKEY_CTX *ctx_local;
  
  label.len = (size_t)out_label;
  iVar1 = EVP_PKEY_CTX_ctrl((EVP_PKEY_CTX *)ctx,6,0xc0,0x100c,0,local_30);
  if (iVar1 == 0) {
    ctx_local._4_4_ = -1;
  }
  else {
    sVar2 = CBS_len((CBS *)local_30);
    if (sVar2 < 0x80000000) {
      puVar3 = CBS_data((CBS *)local_30);
      *(uint8_t **)label.len = puVar3;
      sVar2 = CBS_len((CBS *)local_30);
      ctx_local._4_4_ = (int)sVar2;
    }
    else {
      ERR_put_error(6,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x25c);
      ctx_local._4_4_ = -1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int EVP_PKEY_CTX_get0_rsa_oaep_label(EVP_PKEY_CTX *ctx,
                                     const uint8_t **out_label) {
  CBS label;
  if (!EVP_PKEY_CTX_ctrl(ctx, EVP_PKEY_RSA, EVP_PKEY_OP_TYPE_CRYPT,
                         EVP_PKEY_CTRL_GET_RSA_OAEP_LABEL, 0, &label)) {
    return -1;
  }
  if (CBS_len(&label) > INT_MAX) {
    OPENSSL_PUT_ERROR(EVP, ERR_R_OVERFLOW);
    return -1;
  }
  *out_label = CBS_data(&label);
  return (int)CBS_len(&label);
}